

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O2

string * __thiscall JFSON::esc_abi_cxx11_(string *__return_storage_ptr__,JFSON *this,char c)

{
  allocator local_15;
  char buf [12];
  
  if ((char)this < ' ') {
    snprintf(buf,0xc,"(%d)",(ulong)(uint)(int)(char)this);
  }
  else {
    snprintf(buf,0xc,"\'%c\' (%d)",(ulong)this & 0xff,(ulong)this & 0xff);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,buf,&local_15);
  return __return_storage_ptr__;
}

Assistant:

static inline string esc(char c) {
    char buf[12];
    if (static_cast<uint8_t>(c) >= 0x20 && static_cast<uint8_t>(c) <= 0x7f) {
        snprintf(buf, sizeof buf, "'%c' (%d)", c, c);
    } else {
        snprintf(buf, sizeof buf, "(%d)", c);
    }
    return string(buf);
}